

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_state_machine(tftp_state_data *state,tftp_event_t event)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Curl_easy *data;
  uchar *puVar4;
  curl_trc_feat *pcVar5;
  long size;
  Curl_sockaddr_ex *pCVar6;
  char *pcVar7;
  CURLcode CVar8;
  size_t sVar9;
  size_t sVar10;
  int *piVar11;
  tftp_event_t event_00;
  char *pcVar12;
  size_t sbytes;
  char *filename;
  char buf [64];
  size_t local_148;
  char *local_140;
  char local_138 [264];
  
  data = state->data;
  switch(state->state) {
  case TFTP_STATE_START:
    uVar1 = *(uint *)&(data->state).field_0x744;
    pcVar12 = "netascii";
    if ((uVar1 >> 0xc & 1) == 0) {
      pcVar12 = "octet";
    }
    break;
  case TFTP_STATE_RX:
    CVar8 = tftp_rx(state,event);
    return CVar8;
  case TFTP_STATE_TX:
    CVar8 = tftp_tx(state,event);
    return CVar8;
  case TFTP_STATE_FIN:
    if (data == (Curl_easy *)0x0) {
      return CURLE_OK;
    }
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar5 = (data->state).feat;
      if ((pcVar5 != (curl_trc_feat *)0x0) && (pcVar5->log_level < 1)) {
        return CURLE_OK;
      }
      Curl_infof(data,"%s","TFTP finished");
      return CURLE_OK;
    }
    return CURLE_OK;
  default:
    Curl_failf(data,"%s","Internal state machine error");
    return CURLE_TFTP_ILLEGAL;
  }
  switch(event) {
  case TFTP_EVENT_INIT:
  case TFTP_EVENT_TIMEOUT:
    iVar2 = state->retries;
    state->retries = iVar2 + 1;
    if (iVar2 < state->retry_max) {
      uVar3 = *(uint *)&(data->state).field_0x744;
      *(state->spacket).data = '\0';
      puVar4 = (state->spacket).data;
      if ((uVar3 >> 0x11 & 1) == 0) {
        puVar4[1] = '\x01';
      }
      else {
        puVar4[1] = '\x02';
        size = (data->state).infilesize;
        if (size != -1) {
          Curl_pgrsSetUploadSize(data,size);
        }
      }
      CVar8 = Curl_urldecode((state->data->state).up.path + 1,0,&local_140,(size_t *)0x0,REJECT_ZERO
                            );
      pcVar7 = local_140;
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      sVar9 = strlen(local_140);
      if (((ulong)((uint)((uVar1 >> 0xc & 1) == 0) * 3) | 0xfffffffffffffff4) + (long)state->blksize
          < sVar9) {
        pcVar12 = "TFTP filename too long";
LAB_0015d2f9:
        Curl_failf(data,pcVar12);
        (*Curl_cfree)(local_140);
        return CURLE_TFTP_ILLEGAL;
      }
      CVar8 = CURLE_OK;
      curl_msnprintf((char *)((state->spacket).data + 2),(long)state->blksize,"%s%c%s%c",pcVar7,0,
                     pcVar12,0);
      sVar9 = strlen(local_140);
      sVar9 = sVar9 + (ulong)(uVar1 >> 0xc & 1) * 3 + 9;
      local_148 = sVar9;
      if (((data->set).field_0x8ca & 4) == 0) {
        if ((((data->state).field_0x746 & 2) == 0) || ((data->state).infilesize == -1)) {
          local_138[0] = '0';
          local_138[1] = '\0';
        }
        else {
          curl_msnprintf(local_138,0x40,"%ld");
        }
        CVar8 = tftp_option_add(state,&local_148,(char *)((state->spacket).data + sVar9),"tsize");
        if (CVar8 == CURLE_OK) {
          CVar8 = tftp_option_add(state,&local_148,(char *)((state->spacket).data + local_148),
                                  local_138);
        }
        curl_msnprintf(local_138,0x40,"%d",(ulong)(uint)state->requested_blksize);
        if (CVar8 == CURLE_OK) {
          CVar8 = tftp_option_add(state,&local_148,(char *)((state->spacket).data + local_148),
                                  "blksize");
        }
        if (CVar8 == CURLE_OK) {
          CVar8 = tftp_option_add(state,&local_148,(char *)((state->spacket).data + local_148),
                                  local_138);
        }
        curl_msnprintf(local_138,0x40,"%d");
        if (CVar8 == CURLE_OK) {
          CVar8 = tftp_option_add(state,&local_148,(char *)((state->spacket).data + local_148),
                                  "timeout");
        }
        if (CVar8 == CURLE_OK) {
          CVar8 = tftp_option_add(state,&local_148,(char *)((state->spacket).data + local_148),
                                  local_138);
        }
        if (CVar8 != CURLE_OK) {
          pcVar12 = "TFTP buffer too small for options";
          goto LAB_0015d2f9;
        }
      }
      sVar9 = local_148;
      pCVar6 = data->conn->remote_addr;
      sVar10 = sendto(state->sockfd,(state->spacket).data,local_148,0,
                      (sockaddr *)&(pCVar6->_sa_ex_u).addr,pCVar6->addrlen);
      if (sVar10 != sVar9) {
        piVar11 = __errno_location();
        pcVar12 = Curl_strerror(*piVar11,local_138,0x100);
        Curl_failf(data,"%s",pcVar12);
      }
      (*Curl_cfree)(local_140);
      return CVar8;
    }
    state->error = TFTP_ERR_NORESPONSE;
  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    CVar8 = CURLE_OK;
    break;
  default:
    Curl_failf(data,"tftp_send_first: internal error");
    return CURLE_OK;
  case TFTP_EVENT_DATA:
    event_00 = TFTP_EVENT_DATA;
    goto LAB_0015d0a6;
  case TFTP_EVENT_ACK:
    event_00 = TFTP_EVENT_ACK;
LAB_0015d0b5:
    CVar8 = tftp_connect_for_tx(state,event_00);
    return CVar8;
  case TFTP_EVENT_OACK:
    event_00 = TFTP_EVENT_OACK;
    if ((uVar1 >> 0x11 & 1) != 0) goto LAB_0015d0b5;
LAB_0015d0a6:
    CVar8 = tftp_connect_for_rx(state,event_00);
  }
  return CVar8;
}

Assistant:

static CURLcode tftp_state_machine(struct tftp_state_data *state,
                                   tftp_event_t event)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = state->data;

  switch(state->state) {
  case TFTP_STATE_START:
    DEBUGF(infof(data, "TFTP_STATE_START"));
    result = tftp_send_first(state, event);
    break;
  case TFTP_STATE_RX:
    DEBUGF(infof(data, "TFTP_STATE_RX"));
    result = tftp_rx(state, event);
    break;
  case TFTP_STATE_TX:
    DEBUGF(infof(data, "TFTP_STATE_TX"));
    result = tftp_tx(state, event);
    break;
  case TFTP_STATE_FIN:
    infof(data, "%s", "TFTP finished");
    break;
  default:
    DEBUGF(infof(data, "STATE: %d", state->state));
    failf(data, "%s", "Internal state machine error");
    result = CURLE_TFTP_ILLEGAL;
    break;
  }

  return result;
}